

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> * __thiscall
QPDF::getCompressibleObjGens<QPDFObjGen>
          (vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *__return_storage_ptr__,QPDF *this)

{
  BaseHandle *this_00;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  pointer pQVar2;
  bool bVar3;
  int iVar4;
  QPDFObjGen QVar5;
  size_t __n;
  unsigned_long __n_00;
  iterator iVar6;
  long lVar7;
  logic_error *this_01;
  reference rVar8;
  allocator<char> local_154;
  allocator<char> local_153;
  allocator<char> local_152;
  allocator<char> local_151;
  QPDFObjGen og;
  Dictionary dict;
  value_type obj;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> queue;
  const_reverse_iterator iter;
  const_reverse_iterator end;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0 [3];
  ulong local_a8;
  size_t local_a0;
  undefined1 local_98 [16];
  QPDFObjectHandle encryption_dict;
  vector<bool,_std::allocator<bool>_> visited;
  string local_50;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&visited,"/Encrypt",(allocator<char> *)&dict);
  QPDFObjectHandle::getKey(&encryption_dict,(string *)&(_Var1._M_head_impl)->trailer);
  std::__cxx11::string::~string((string *)&visited);
  QVar5 = QPDFObjectHandle::getObjGen(&encryption_dict);
  __n = getObjectCount(this);
  dict.super_BaseDictionary.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       (uint)dict.super_BaseDictionary.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&visited,__n,(bool *)&dict,(allocator_type *)&end);
  queue.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  queue.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  queue.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::reserve(&queue,0x200);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
            (&queue,&((this->m)._M_t.
                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
                      .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->trailer);
  (__return_storage_ptr__->super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0 = __n;
  std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::reserve
            (__return_storage_ptr__,
             *(size_t *)
              ((long)&((this->m)._M_t.
                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache + 0x28
              ));
  local_a8 = (ulong)QVar5 >> 0x20;
  do {
    if (queue.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_start ==
        queue.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&queue);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&visited.super__Bvector_base<std::allocator<bool>_>);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&encryption_dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return __return_storage_ptr__;
    }
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&obj,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
               (queue.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish + -1));
    pQVar2 = queue.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    queue.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_finish =
         queue.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(pQVar2->super_BaseHandle).obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    iVar4 = QPDFObjectHandle::getObjectID((QPDFObjectHandle *)&obj);
    if (iVar4 < 1) {
LAB_001e7c2e:
      bVar3 = QPDFObjectHandle::isStream((QPDFObjectHandle *)&obj);
      if (bVar3) {
        QPDFObjectHandle::getDict((QPDFObjectHandle *)&end);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&dict,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&end);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_c0);
        ::qpdf::BaseDictionary::crend_abi_cxx11_(&end,(BaseDictionary *)&dict);
        ::qpdf::BaseDictionary::crbegin_abi_cxx11_(&iter,(BaseDictionary *)&dict);
        for (; iter.current._M_node != end.current._M_node;
            iter.current._M_node =
                 (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
                  )std::_Rb_tree_decrement((_Rb_tree_node_base *)iter.current._M_node)) {
          lVar7 = std::_Rb_tree_decrement((_Rb_tree_node_base *)iter.current._M_node);
          this_00 = (BaseHandle *)(lVar7 + 0x40);
          bVar3 = ::qpdf::BaseHandle::null(this_00);
          if (!bVar3) {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(lVar7 + 0x20),"/Length");
            if (bVar3) {
              QPDFObjectHandle::isIndirect((QPDFObjectHandle *)this_00);
            }
            else {
              std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
              emplace_back<QPDFObjectHandle_const&>
                        ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)&queue,
                         (QPDFObjectHandle *)this_00);
            }
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&dict.super_BaseDictionary.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      else {
        bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&obj);
        if (bVar3) {
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&dict,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&obj);
          ::qpdf::BaseDictionary::crend_abi_cxx11_(&end,(BaseDictionary *)&dict);
          ::qpdf::BaseDictionary::crbegin_abi_cxx11_(&iter,(BaseDictionary *)&dict);
          for (; iter.current._M_node != end.current._M_node;
              iter.current._M_node =
                   (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
                    )std::_Rb_tree_decrement((_Rb_tree_node_base *)iter.current._M_node)) {
            lVar7 = std::_Rb_tree_decrement((_Rb_tree_node_base *)iter.current._M_node);
            bVar3 = ::qpdf::BaseHandle::null((BaseHandle *)(lVar7 + 0x40));
            if (!bVar3) {
              lVar7 = std::_Rb_tree_decrement((_Rb_tree_node_base *)iter.current._M_node);
              std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
              emplace_back<QPDFObjectHandle_const&>
                        ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)&queue,
                         (QPDFObjectHandle *)(lVar7 + 0x40));
            }
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&dict.super_BaseDictionary.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        else {
          ::qpdf::Array::Array((Array *)&dict,(shared_ptr<QPDFObject> *)&obj);
          pQVar2 = queue.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (CONCAT44(dict.super_BaseDictionary.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                       (uint)dict.super_BaseDictionary.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr) != 0
             ) {
            ::qpdf::Array::crbegin((Array *)(local_98 + 8));
            ::qpdf::Array::crend((Array *)local_98);
            std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
            insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<QPDFObjectHandle_const*,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>>>,void>
                      ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)&queue,
                       (const_iterator)pQVar2,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                        *)(local_98 + 8),
                       (reverse_iterator<__gnu_cxx::__normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                        *)local_98);
          }
          ::qpdf::Array::~Array((Array *)&dict);
        }
      }
    }
    else {
      og = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&obj);
      dict.super_BaseDictionary.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = og.obj - 1;
      __n_00 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert((int *)&dict);
      if (local_a0 <= __n_00) {
        this_01 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_01,"unexpected object id encountered in getCompressibleObjGens");
        __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited,__n_00);
      if ((*rVar8._M_p & rVar8._M_mask) == 0) {
        iVar6 = std::
                _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDF::ObjCache>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                ::upper_bound(&(((this->m)._M_t.
                                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                 .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                               obj_cache)._M_t,&og);
        if ((iVar6._M_node ==
             (_Base_ptr)
             ((long)&((this->m)._M_t.
                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
                      .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache + 8U))
           || (iVar6._M_node[1]._M_color != og.obj)) {
          rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited,__n_00);
          *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
          if (((og.obj == QVar5.obj) && (og.gen == (int)local_a8)) ||
             (bVar3 = QPDFObjectHandle::isStream((QPDFObjectHandle *)&obj), bVar3))
          goto LAB_001e7c2e;
          std::__cxx11::string::string<std::allocator<char>>((string *)&dict,"/Sig",&local_151);
          std::__cxx11::string::string<std::allocator<char>>((string *)&end,"",&local_152);
          bVar3 = QPDFObjectHandle::isDictionaryOfType
                            ((QPDFObjectHandle *)&obj,(string *)&dict,(string *)&end);
          if (bVar3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&iter,"/ByteRange",&local_153);
            bVar3 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&obj,(string *)&iter);
            if (!bVar3) {
              std::__cxx11::string::~string((string *)&iter);
              goto LAB_001e7c08;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,"/Contents",&local_154);
            bVar3 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&obj,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&iter);
            std::__cxx11::string::~string((string *)&end);
            std::__cxx11::string::~string((string *)&dict);
            if (bVar3) goto LAB_001e7c2e;
          }
          else {
LAB_001e7c08:
            std::__cxx11::string::~string((string *)&end);
            std::__cxx11::string::~string((string *)&dict);
          }
          std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::push_back
                    (__return_storage_ptr__,&og);
          goto LAB_001e7c2e;
        }
        removeObject(this,og);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  } while( true );
}

Assistant:

std::vector<T>
QPDF::getCompressibleObjGens()
{
    // Return a list of objects that are allowed to be in object streams.  Walk through the objects
    // by traversing the document from the root, including a traversal of the pages tree.  This
    // makes that objects that are on the same page are more likely to be in the same object stream,
    // which is slightly more efficient, particularly with linearized files.  This is better than
    // iterating through the xref table since it avoids preserving orphaned items.

    // Exclude encryption dictionary, if any
    QPDFObjectHandle encryption_dict = m->trailer.getKey("/Encrypt");
    QPDFObjGen encryption_dict_og = encryption_dict.getObjGen();

    const size_t max_obj = getObjectCount();
    std::vector<bool> visited(max_obj, false);
    std::vector<QPDFObjectHandle> queue;
    queue.reserve(512);
    queue.push_back(m->trailer);
    std::vector<T> result;
    if constexpr (std::is_same_v<T, QPDFObjGen>) {
        result.reserve(m->obj_cache.size());
    } else if constexpr (std::is_same_v<T, bool>) {
        result.resize(max_obj + 1U, false);
    } else {
        throw std::logic_error("Unsupported type in QPDF::getCompressibleObjGens");
    }
    while (!queue.empty()) {
        auto obj = queue.back();
        queue.pop_back();
        if (obj.getObjectID() > 0) {
            QPDFObjGen og = obj.getObjGen();
            const size_t id = toS(og.getObj() - 1);
            if (id >= max_obj) {
                throw std::logic_error(
                    "unexpected object id encountered in getCompressibleObjGens");
            }
            if (visited[id]) {
                QTC::TC("qpdf", "QPDF loop detected traversing objects");
                continue;
            }

            // Check whether this is the current object. If not, remove it (which changes it into a
            // direct null and therefore stops us from revisiting it) and move on to the next object
            // in the queue.
            auto upper = m->obj_cache.upper_bound(og);
            if (upper != m->obj_cache.end() && upper->first.getObj() == og.getObj()) {
                removeObject(og);
                continue;
            }

            visited[id] = true;

            if (og == encryption_dict_og) {
                QTC::TC("qpdf", "QPDF exclude encryption dictionary");
            } else if (!(obj.isStream() ||
                         (obj.isDictionaryOfType("/Sig") && obj.hasKey("/ByteRange") &&
                          obj.hasKey("/Contents")))) {
                if constexpr (std::is_same_v<T, QPDFObjGen>) {
                    result.push_back(og);
                } else if constexpr (std::is_same_v<T, bool>) {
                    result[id + 1U] = true;
                }
            }
        }
        if (obj.isStream()) {
            auto dict = obj.getDict().as_dictionary();
            auto end = dict.crend();
            for (auto iter = dict.crbegin(); iter != end; ++iter) {
                std::string const& key = iter->first;
                QPDFObjectHandle const& value = iter->second;
                if (!value.null()) {
                    if (key == "/Length") {
                        // omit stream lengths
                        if (value.isIndirect()) {
                            QTC::TC("qpdf", "QPDF exclude indirect length");
                        }
                    } else {
                        queue.emplace_back(value);
                    }
                }
            }
        } else if (obj.isDictionary()) {
            auto dict = obj.as_dictionary();
            auto end = dict.crend();
            for (auto iter = dict.crbegin(); iter != end; ++iter) {
                if (!iter->second.null()) {
                    queue.emplace_back(iter->second);
                }
            }
        } else if (auto items = obj.as_array()) {
            queue.insert(queue.end(), items.crbegin(), items.crend());
        }
    }

    return result;
}